

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_start(Context *ctx,char *profilestr)

{
  byte bVar1;
  uint uVar2;
  char local_38 [8];
  char minor_str [16];
  uint minor;
  uint major;
  char *profilestr_local;
  Context *ctx_local;
  
  bVar1 = ctx->major_ver;
  uVar2 = (uint)ctx->minor_ver;
  ctx->ignores_ctab = 1;
  if (uVar2 == 0xff) {
    strcpy(local_38,"sw");
  }
  else if ((bVar1 < 2) || (uVar2 != 1)) {
    snprintf(local_38,0x10,"%u",(ulong)uVar2);
  }
  else {
    strcpy(local_38,"x");
  }
  output_line(ctx,"%s_%u_%s",ctx->shader_type_str,(ulong)(uint)bVar1,local_38);
  return;
}

Assistant:

static void emit_D3D_start(Context *ctx, const char *profilestr)
{
    const uint major = (uint) ctx->major_ver;
    const uint minor = (uint) ctx->minor_ver;
    char minor_str[16];

    ctx->ignores_ctab = 1;

    if (minor == 0xFF)
        strcpy(minor_str, "sw");
    else if ((major > 1) && (minor == 1))
        strcpy(minor_str, "x");  // for >= SM2, apparently this is "x". Weird.
    else
        snprintf(minor_str, sizeof (minor_str), "%u", (uint) minor);

    output_line(ctx, "%s_%u_%s", ctx->shader_type_str, major, minor_str);
}